

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void render_stuff(ImageBuffer *buffer,SDL_Window *window,int max_samples,int max_seconds,
                 _Bool uniform_sampling)

{
  Vec3 origin;
  Vec3 origin_00;
  Vec3 origin_01;
  Vec3 pos;
  undefined1 auVar1 [64];
  _Bool _Var2;
  uint uVar3;
  uint num_threads;
  int iVar4;
  uint uVar5;
  code *pcVar6;
  Sampler *samplers_00;
  long lVar7;
  Color CVar8;
  long total_seconds;
  char total_time [256];
  long now;
  int t;
  Sampler *samplers;
  int n_cores;
  long t0;
  long samples;
  undefined8 uStack_700;
  _Bool quit;
  undefined4 local_6f8;
  undefined8 local_6f0;
  undefined4 local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d8;
  undefined4 local_6cc;
  undefined4 uStack_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 uStack_6b0;
  undefined4 local_6ac;
  undefined8 local_6a8;
  undefined4 local_6a0;
  undefined8 local_698;
  undefined4 local_690;
  undefined8 local_688;
  undefined4 local_680;
  undefined4 local_674;
  undefined4 uStack_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 uStack_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 uStack_658;
  undefined4 local_654;
  undefined8 local_650;
  undefined4 local_648;
  undefined8 local_640;
  undefined4 local_638;
  undefined8 local_630;
  undefined4 local_628;
  undefined4 local_61c;
  undefined4 uStack_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 uStack_600;
  undefined4 local_5fc;
  undefined8 local_5f8;
  undefined4 local_5f0;
  undefined8 local_5e8;
  undefined4 local_5e0;
  undefined8 local_5d8;
  undefined4 local_5d0;
  undefined4 local_5c4;
  undefined4 uStack_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 uStack_5a8;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined4 local_598;
  undefined8 local_590;
  undefined4 local_588;
  undefined8 local_580;
  undefined4 local_578;
  undefined4 local_56c;
  undefined4 uStack_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 uStack_550;
  undefined4 local_54c;
  undefined8 local_548;
  undefined4 local_540;
  undefined8 local_538;
  undefined4 local_530;
  undefined8 local_528;
  undefined4 local_520;
  undefined4 local_514;
  undefined4 uStack_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 uStack_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 uStack_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0 [2];
  PartialPlane local_4e8;
  void ***local_4a0;
  undefined4 local_498;
  Light *local_490;
  void ***local_448;
  undefined4 local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  float *local_3f0;
  undefined4 local_3e8;
  PartialPlane local_3e0;
  void **local_398;
  undefined4 local_390;
  PartialPlane local_388;
  void **local_340;
  undefined4 local_338;
  PartialPlane local_330;
  void **local_2e8;
  undefined4 local_2e0;
  PartialPlane local_2d8;
  void **local_290;
  undefined4 local_288;
  PartialPlane local_280;
  void **local_238;
  undefined1 local_230 [8];
  Scene sc;
  TriangleMesh suzanne;
  undefined1 auStack_1bc [4];
  Camera cam;
  float fov;
  float ratio;
  Light l;
  Material mirror_mat;
  BSDF mirror;
  void **local_128;
  Material emissive_mat;
  BSDF emissive;
  void **local_f8;
  Material yellow_mat;
  Material green_mat;
  Material red_mat;
  Material white_mat;
  BSDF lambert;
  Color yellow;
  Color green;
  Color red;
  undefined1 local_40 [8];
  Color cream;
  Color white;
  _Bool uniform_sampling_local;
  int max_seconds_local;
  int max_samples_local;
  SDL_Window *window_local;
  ImageBuffer *buffer_local;
  
  stack0xffffffffffffffd0 = (BSDFSampler)0x3f8000003f800000;
  CVar8.b = 0.8;
  CVar8.r = 1.0;
  CVar8.g = 0.9;
  CVar8 = cscale(CVar8,80.0);
  cream.r = CVar8.b;
  local_40 = CVar8._0_8_;
  stack0xffffffffffffff80 = 0x3f800000;
  stack0xffffffffffffff70 = 0x3f80000000000000;
  green.r = 0.0;
  lambert.sampler = (BSDFSampler)0x3f8000003f800000;
  yellow.r = 0.0;
  white_mat.params = (void *)0x0;
  lambert.emitted = lambert_bsdf;
  pcVar6 = cosine_weighted_bsdf_sampler;
  if (uniform_sampling) {
    pcVar6 = uniform_bsdf_sampler;
  }
  local_f8 = &white_mat.params;
  white_mat.bsdf = (BSDF *)&cream.b;
  red_mat.bsdf = (BSDF *)&green.b;
  green_mat.bsdf = (BSDF *)&yellow.b;
  yellow_mat.bsdf = (BSDF *)&lambert.sampler;
  emissive_mat.params = isotropic_emission;
  local_128 = &emissive_mat.params;
  emissive_mat.bsdf = (BSDF *)local_40;
  mirror_mat.params = (void *)0x0;
  unique0x00004880 = &mirror_mat.params;
  mirror_mat.bsdf = (BSDF *)0x0;
  l.position.z = 1.0;
  l.color.r = 0.5;
  l.color.g = 3.0;
  _fov = 0x3f80000000000000;
  l.position.x = 2.0;
  l.position.y = 0.3;
  cam.camera.perspective.depth = (float)buffer->width / (float)buffer->height;
  cam.camera.perspective.yscale = 90.0;
  pos.z = 3.0;
  pos.x = -7.5;
  pos.y = 0.0;
  yellow_mat.params = local_f8;
  green_mat.params = local_f8;
  red_mat.params = local_f8;
  lambert.f = pcVar6;
  create_perspective_camera
            ((PerspectiveCamera *)auStack_1bc,pos,(Vec3)(ZEXT412(0x40400000) << 0x40),
             cam.camera.perspective.depth,90.0);
  _Var2 = read_obj_file((TriangleMesh *)&sc.lights,"res/suzanne.obj");
  if (_Var2) {
    local_230 = (undefined1  [8])0x0;
    local_4f0[0] = 1;
    local_4fc = 0;
    uStack_4f8 = 0;
    local_4f4 = 0x40be6666;
    local_508 = 0x3f800000;
    uStack_504 = 0;
    local_500 = 0;
    local_514 = 0;
    uStack_510 = 0x3f800000;
    local_50c = 0;
    local_520 = 0x40be6666;
    local_528 = 0;
    local_530 = 0;
    local_538 = 0x3f800000;
    local_540 = 0;
    local_548 = 0x3f80000000000000;
    create_partial_plane
              (&local_4e8,(Vec3)(ZEXT412(0x40be6666) << 0x40),(Vec3)ZEXT812(0x3f800000),
               (Vec3)ZEXT812(0x3f80000000000000),-1.0,-1.0,1.0,1.0);
    local_4a0 = &local_128;
    local_498 = 4;
    local_490 = sc.lights;
    local_448 = &local_f8;
    local_440 = 2;
    local_408 = 0;
    uStack_400 = 0;
    local_418 = 0;
    uStack_410 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_3f8 = 0;
    local_438 = 0x3fc000003f99999a;
    uStack_430 = 0x3f8ccccd3f8ccccd;
    local_3f0 = &l.intensity;
    local_3e8 = 1;
    local_554 = 0;
    uStack_550 = 0xc0400000;
    local_54c = 0x40400000;
    local_560 = 0x3f800000;
    uStack_55c = 0;
    local_558 = 0;
    local_56c = 0;
    uStack_568 = 0;
    local_564 = 0x3f800000;
    local_578 = 0x40400000;
    local_580 = 0xc040000000000000;
    origin_01.z = 3.0;
    origin_01.x = 0.0;
    origin_01.y = -3.0;
    local_588 = 0;
    local_590 = 0x3f800000;
    local_598 = 0x3f800000;
    local_5a0 = 0;
    create_partial_plane
              (&local_3e0,origin_01,(Vec3)ZEXT812(0x3f800000),(Vec3)(ZEXT412(0x3f800000) << 0x40),
               -3.0,-3.0,3.0,3.0);
    local_398 = &yellow_mat.params;
    local_390 = 1;
    local_5ac = 0x40400000;
    uStack_5a8 = 0;
    local_5a4 = 0x40400000;
    local_5b8 = 0;
    uStack_5b4 = 0x3f800000;
    local_5b0 = 0;
    local_5c4 = 0;
    uStack_5c0 = 0;
    local_5bc = 0x3f800000;
    local_5d0 = 0x40400000;
    local_5d8 = 0x40400000;
    origin_00.z = 3.0;
    origin_00.x = 3.0;
    origin_00.y = 0.0;
    local_5e0 = 0;
    local_5e8 = 0x3f80000000000000;
    local_5f0 = 0x3f800000;
    local_5f8 = 0;
    create_partial_plane
              (&local_388,origin_00,(Vec3)ZEXT812(0x3f80000000000000),
               (Vec3)(ZEXT412(0x3f800000) << 0x40),-3.0,-3.0,3.0,3.0);
    local_338 = 1;
    local_604 = 0;
    uStack_600 = 0x40400000;
    local_5fc = 0x40400000;
    local_610 = 0x3f800000;
    uStack_60c = 0;
    local_608 = 0;
    local_61c = 0;
    uStack_618 = 0;
    local_614 = 0x3f800000;
    local_628 = 0x40400000;
    local_630 = 0x4040000000000000;
    origin.z = 3.0;
    origin.x = 0.0;
    origin.y = 3.0;
    local_638 = 0;
    local_640 = 0x3f800000;
    local_648 = 0x3f800000;
    local_650 = 0;
    local_340 = &red_mat.params;
    create_partial_plane
              (&local_330,origin,(Vec3)ZEXT812(0x3f800000),(Vec3)(ZEXT412(0x3f800000) << 0x40),-3.0,
               -3.0,3.0,3.0);
    local_2e8 = &green_mat.params;
    local_2e0 = 1;
    local_65c = 0;
    uStack_658 = 0;
    local_654 = 0;
    local_668 = 0x3f800000;
    uStack_664 = 0;
    local_660 = 0;
    local_674 = 0;
    uStack_670 = 0x3f800000;
    local_66c = 0;
    local_680 = 0;
    local_688 = 0;
    local_690 = 0;
    local_698 = 0x3f800000;
    local_6a0 = 0;
    local_6a8 = 0x3f80000000000000;
    create_partial_plane
              (&local_2d8,(Vec3)ZEXT812(0),(Vec3)ZEXT812(0x3f800000),
               (Vec3)ZEXT812(0x3f80000000000000),-3.0,-3.0,3.0,3.0);
    local_288 = 1;
    local_6b4 = 0;
    uStack_6b0 = 0;
    local_6ac = 0x40c00000;
    local_6c0 = 0x3f800000;
    uStack_6bc = 0;
    local_6b8 = 0;
    local_6cc = 0;
    uStack_6c8 = 0x3f800000;
    local_6c4 = 0;
    local_6d8 = 0x40c00000;
    local_6e0 = 0;
    local_6e8 = 0;
    local_6f0 = 0x3f800000;
    local_6f8 = 0;
    uStack_700 = 0x3f80000000000000;
    local_290 = &red_mat.params;
    create_partial_plane
              (&local_280,(Vec3)(ZEXT412(0x40c00000) << 0x40),(Vec3)ZEXT812(0x3f800000),
               (Vec3)ZEXT812(0x3f80000000000000),-3.0,-3.0,3.0,3.0);
    local_238 = &red_mat.params;
    sc.object_count = (size_t)local_4f0;
    sc.objects = (Object *)0x1;
    sc.light_count = (size_t)&fov;
    local_230 = (undefined1  [8])0x8;
    clear_buffer(buffer);
    samples._7_1_ = 0;
    t0 = 0;
    uVar3 = SDL_GetTicks();
    num_threads = get_nprocs();
    printf("Detected %1$d cores, rendering with %1$d threads.\n",(ulong)num_threads);
    samplers_00 = (Sampler *)malloc((long)buffer->width * 0x68 * (long)buffer->height);
    create_samplers(samplers_00,(long)(buffer->width * buffer->height));
    while (((samples._7_1_ ^ 0xff) & 1) != 0) {
      iVar4 = SDL_GetTicks();
      handle_events((_Bool *)((long)&samples + 7));
      auVar1._4_4_ = cam.kind;
      auVar1._0_4_ = auStack_1bc;
      auVar1._8_4_ = cam.camera._0_4_;
      auVar1._12_8_ = cam.camera._4_8_;
      auVar1._20_8_ = cam.camera._12_8_;
      auVar1._28_8_ = cam.camera._20_8_;
      auVar1._36_8_ = cam.camera._28_8_;
      auVar1._44_8_ = cam.camera._36_8_;
      auVar1._52_8_ = cam.camera._44_8_;
      auVar1._60_4_ = 0;
      sample_scene_master((Scene *)local_230,(Camera)(auVar1 << 0x20),buffer,samplers_00,num_threads
                         );
      render_buffer(window,buffer,2.2);
      SDL_UpdateWindowSurface(window);
      t0 = t0 + 1;
      uVar5 = SDL_GetTicks();
      total_time._248_8_ = ZEXT48(uVar5);
      lVar7 = (long)(total_time._248_8_ - (ulong)uVar3) / 1000;
      format_time((int)lVar7,(char *)&total_seconds);
      printf("%6ld samples | last %4ldms | average %4ldms | total %s\r",t0,
             total_time._248_8_ - (long)iVar4,(long)(total_time._248_8_ - (ulong)uVar3) / t0,
             &total_seconds);
      fflush(_stdout);
      if (((0 < max_samples) && (max_samples <= t0)) ||
         ((0 < max_seconds && (max_seconds <= lVar7)))) {
        samples._7_1_ = 1;
      }
    }
    free(samplers_00);
  }
  return;
}

Assistant:

void render_stuff(ImageBuffer* buffer,
                  SDL_Window* window,
                  int max_samples,
                  int max_seconds,
                  bool uniform_sampling) {
    Color white = {1.0f, 1.0f, 1.0f};
    Color cream = cscale((Color){1.0f, .9f, .8f}, 80.0f);
    Color red = {1.0f, .0f, .0f};
    Color green = {0.0f, 1.0f, .0f};
    Color yellow = {1.0f, 1.0f, .0f};

    BSDF lambert = {
        .f = lambert_bsdf,
        .sampler = uniform_sampling ? uniform_bsdf_sampler : cosine_weighted_bsdf_sampler,
        .emitted = NULL
    };
    Material white_mat = {
        .bsdf = &lambert,
        .params = &white
    };
    Material red_mat = {
        .bsdf = &lambert,
        .params = &red
    };
    Material green_mat = {
        .bsdf = &lambert,
        .params = &green
    };
    Material yellow_mat = {
        .bsdf = &lambert,
        .params = &yellow
    };

    BSDF emissive = {
        .f = NULL,
        .sampler = NULL,
        .emitted = isotropic_emission
    };
    Material emissive_mat = {
        .bsdf = &emissive,
        .params = &cream
    };

    BSDF mirror = {
        .f = perfect_reflection_bsdf,
        .sampler = perfect_reflection_sampler,
        .emitted = NULL
    };
    Material mirror_mat = {
        .bsdf = &mirror,
        .params = NULL
    };
    
    Light l = {
        .position = {.0f, 1.0f, 2.0f},
        .color = {.3f, 1.0f, .5f},
        .intensity = 3.0f,
    };
    
    float ratio = (float) buffer->width / buffer->height;
    float fov = 90.0f;
    Camera cam = {
        .kind = PERSPECTIVE,
        .camera = {
            .perspective = create_perspective_camera(
                (Vec3) {-7.5f, 0.0f, 3.0f},
                (Vec3) {0.0f, 0.0f, 3.0f},
                ratio,
                fov)
        }
    };

    TriangleMesh suzanne;
    if (!read_obj_file(&suzanne, "res/suzanne.obj"))
        return;

    Scene sc = {
        .objects = (Object[]) {
            // light
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 0.0f, 5.95f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        -1, -1,
                        1, 1
                        )
                },
                .material = &emissive_mat,
            },
            /* { */
            /* 	.kind = GEO_SPHERE, */
            /* 	.geometry = { */
            /* 	    .sphere = { */
            /* 		.center = {1.3f, -.5f, 1.5f}, */
            /* 		.radius = 1.5f, */
            /* 	    } */
            /* 	}, */
            /* 	.material = &yellow_mat */
            /* }, */
            {
                .kind = GEO_TRIANGLE_MESH,
                .geometry = {
                    .triangle_mesh = suzanne
                },
                .material = &yellow_mat
            },
            {
                .kind = GEO_SPHERE,
                .geometry = {
                    .sphere = {
                        .center = {1.2f, 1.5f, 1.1f},
                        .radius = 1.1f,
                    }
                },
                .material = &mirror_mat
            },
            // WALLS
            // right
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, -3.0f, 3.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 0.0f, 1.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &green_mat,
            },
            // back
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {3.0f, 0.0f, 3.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        (Vec3) {0.0f, 0.0f, 1.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &white_mat
            },
            // left
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 3.0f, 3.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 0.0f, 1.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &red_mat
            },
            // floor
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 0.0f, 0.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        -3, -3,
                        3, 3
                        )
                },
		
                .material = &white_mat
            },
            // ceiling
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 0.0f, 6.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &white_mat
            }
        },
        .light_count = 1,
        .lights = &l,
    };
    sc.object_count = sizeof(sc.objects);
    
    clear_buffer(buffer);
    bool quit = false;
    long int samples = 0;
    long int t0 = SDL_GetTicks();
    int n_cores = get_nprocs();
    printf("Detected %1$d cores, rendering with %1$d threads.\n", n_cores);
    Sampler* samplers = malloc(sizeof(Sampler) * buffer->width * buffer->height);
    create_samplers(samplers, buffer->width * buffer->height);
    while (!quit) {
        int t = SDL_GetTicks();

        handle_events(&quit);
		
        //sample_scene(&sc, cam, buffer);
        sample_scene_master(&sc, cam, buffer, samplers, n_cores); 
	
        render_buffer(window, buffer, GAMMA);
        SDL_UpdateWindowSurface(window);

        ++samples;
        long int now = SDL_GetTicks();
        char total_time[256];
        long int total_seconds = (now - t0) / 1000;
        format_time(total_seconds, total_time);
        printf("%6ld samples | last %4ldms | average %4ldms | total %s\r",
               samples,
               now - t,
               (now - t0) / samples,
               total_time);
        fflush(stdout);

        if ((max_samples > 0 && samples >= max_samples) ||
            (max_seconds > 0 && total_seconds >= max_seconds)) {
            quit = true;
        }
    }
    free(samplers);
}